

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O3

void __thiscall
fasttext::HierarchicalSoftmaxLoss::buildTree
          (HierarchicalSoftmaxLoss *this,vector<long,_std::allocator<long>_> *counts)

{
  vector<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
  *this_00;
  int iVar1;
  pointer pNVar2;
  pointer plVar3;
  pointer pNVar4;
  uint uVar5;
  bool bVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  bool bVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  vector<bool,_std::allocator<bool>_> *pvVar14;
  long lVar15;
  vector<int,_std::allocator<int>_> path;
  int local_7c;
  undefined1 local_78 [8];
  int *piStack_70;
  _Bit_type *local_68;
  vector<bool,_std::allocator<bool>_> local_60;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  *local_38;
  
  this_00 = &this->tree_;
  std::
  vector<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
  ::resize(this_00,(long)this->osz_ * 2 - 1);
  iVar1 = this->osz_;
  uVar7 = (ulong)iVar1;
  uVar11 = iVar1 * 2 - 1;
  if (0 < (long)uVar7) {
    pNVar2 = (this_00->
             super__Vector_base<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar9 = 1;
    if (1 < (int)uVar11) {
      uVar9 = (ulong)uVar11;
    }
    lVar12 = 0;
    do {
      *(undefined8 *)((long)&pNVar2->parent + lVar12) = 0xffffffffffffffff;
      *(undefined4 *)((long)&pNVar2->right + lVar12) = 0xffffffff;
      *(undefined8 *)((long)&pNVar2->count + lVar12) = 1000000000000000;
      (&pNVar2->binary)[lVar12] = false;
      lVar12 = lVar12 + 0x20;
    } while (uVar9 * 0x20 != lVar12);
    if (0 < iVar1) {
      plVar3 = (counts->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pNVar2 = (this_00->
               super__Vector_base<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar12 = 0;
      do {
        *(undefined8 *)((long)&pNVar2->count + lVar12 * 4) = *(undefined8 *)((long)plVar3 + lVar12);
        lVar12 = lVar12 + 8;
      } while (uVar7 * 8 - lVar12 != 0);
    }
  }
  if (iVar1 < (int)uVar11) {
    uVar8 = iVar1 - 1;
    pNVar2 = (this_00->
             super__Vector_base<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar9 = uVar7;
    do {
      local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_78 = (undefined1  [8])0x0;
      pNVar4 = (this_00->
               super__Vector_base<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pvVar14 = &local_60;
      bVar6 = true;
      do {
        bVar10 = bVar6;
        uVar13 = (uint)uVar9;
        if (((int)uVar8 < 0) || (pNVar4[(int)uVar13].count <= pNVar4[uVar8].count)) {
          uVar9 = (ulong)(uVar13 + 1);
          uVar5 = uVar8;
        }
        else {
          uVar5 = uVar8 - 1;
          uVar13 = uVar8;
        }
        uVar8 = uVar5;
        *(uint *)&(pvVar14->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = uVar13;
        pvVar14 = (vector<bool,_std::allocator<bool>_> *)local_78;
        bVar6 = false;
      } while (bVar10);
      pNVar2[uVar7].left =
           (uint)local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      lVar12 = (long)(int)local_78._0_4_;
      pNVar2[uVar7].right = local_78._0_4_;
      pNVar2[uVar7].count =
           pNVar2[lVar12].count +
           pNVar2[(int)(uint)local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p].count;
      pNVar2[(int)(uint)local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p].parent =
           (int32_t)uVar7;
      pNVar2[lVar12].parent = (int32_t)uVar7;
      pNVar2[lVar12].binary = true;
      uVar7 = uVar7 + 1;
    } while (uVar7 != (long)(int)uVar11);
  }
  if (0 < iVar1) {
    local_38 = &this->codes_;
    lVar12 = 0;
    do {
      local_78 = (undefined1  [8])0x0;
      piStack_70 = (int *)0x0;
      local_68 = (_Bit_type *)0x0;
      local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_offset = 0;
      local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_offset = 0;
      local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
      iVar1 = (this_00->
              super__Vector_base<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
              )._M_impl.super__Vector_impl_data._M_start[lVar12].parent;
      lVar15 = lVar12;
      while (iVar1 != -1) {
        local_7c = iVar1 - this->osz_;
        if ((_Bit_type *)piStack_70 == local_68) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)local_78,(iterator)piStack_70,&local_7c);
        }
        else {
          *piStack_70 = local_7c;
          piStack_70 = piStack_70 + 1;
        }
        std::vector<bool,_std::allocator<bool>_>::push_back
                  (&local_60,
                   (this_00->
                   super__Vector_base<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
                   )._M_impl.super__Vector_impl_data._M_start[lVar15].binary);
        pNVar2 = (this_00->
                 super__Vector_base<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar15 = (long)pNVar2[lVar15].parent;
        iVar1 = pNVar2[lVar15].parent;
      }
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::push_back(&this->paths_,(vector<int,_std::allocator<int>_> *)local_78);
      std::
      vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ::push_back(local_38,&local_60);
      if (local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      }
      if (local_78 != (undefined1  [8])0x0) {
        operator_delete((void *)local_78);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < this->osz_);
  }
  return;
}

Assistant:

void HierarchicalSoftmaxLoss::buildTree(const std::vector<int64_t>& counts) {
  tree_.resize(2 * osz_ - 1);
  for (int32_t i = 0; i < 2 * osz_ - 1; i++) {
    tree_[i].parent = -1;
    tree_[i].left = -1;
    tree_[i].right = -1;
    tree_[i].count = 1e15;
    tree_[i].binary = false;
  }
  for (int32_t i = 0; i < osz_; i++) {
    tree_[i].count = counts[i];
  }
  int32_t leaf = osz_ - 1;
  int32_t node = osz_;
  for (int32_t i = osz_; i < 2 * osz_ - 1; i++) {
    int32_t mini[2] = {0};
    for (int32_t j = 0; j < 2; j++) {
      if (leaf >= 0 && tree_[leaf].count < tree_[node].count) {
        mini[j] = leaf--;
      } else {
        mini[j] = node++;
      }
    }
    tree_[i].left = mini[0];
    tree_[i].right = mini[1];
    tree_[i].count = tree_[mini[0]].count + tree_[mini[1]].count;
    tree_[mini[0]].parent = i;
    tree_[mini[1]].parent = i;
    tree_[mini[1]].binary = true;
  }
  for (int32_t i = 0; i < osz_; i++) {
    std::vector<int32_t> path;
    std::vector<bool> code;
    int32_t j = i;
    while (tree_[j].parent != -1) {
      path.push_back(tree_[j].parent - osz_);
      code.push_back(tree_[j].binary);
      j = tree_[j].parent;
    }
    paths_.push_back(path);
    codes_.push_back(code);
  }
}